

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckCloseSucceedsOnEqual::~TestCheckCloseSucceedsOnEqual
          (TestCheckCloseSucceedsOnEqual *this)

{
  TestCheckCloseSucceedsOnEqual *this_local;
  
  ~TestCheckCloseSucceedsOnEqual(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckCloseSucceedsOnEqual)
{
    bool failure = true;
    {
        RecordingReporter reporter;
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);
        CHECK_CLOSE (1.0f, 1.001f, 0.01f);
        failure = (testResults.GetFailureCount() > 0);
    }

    CHECK(!failure);
}